

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
          (SACSubcaseBase *this,GLuint size,GLuint *values,GLuint min_value)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  puVar4 = (uint *)CONCAT44(in_register_00000034,size);
  uVar3 = (ulong)values & 0xffffffff;
  uVar6 = (ulong)this & 0xffffffff;
  if ((int)this != 0) {
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar4 + uVar6,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar4 + uVar6);
  }
  bVar7 = (int)this == 0;
  if (!bVar7) {
    anon_unknown_0::Output("%u\n",(ulong)*puVar4);
    uVar5 = (ulong)*puVar4;
    if (*puVar4 == (uint)values) {
      uVar3 = 0;
      do {
        if (uVar6 - 1 == uVar3) {
          return uVar6 <= uVar3 + 1;
        }
        uVar1 = uVar3 + 1;
        anon_unknown_0::Output("%u\n",(ulong)puVar4[uVar3 + 1]);
        uVar5 = (ulong)puVar4[uVar3 + 1];
        uVar3 = uVar1;
      } while (((ulong)values & 0xffffffff) + uVar1 == uVar5);
      bVar7 = uVar6 <= uVar1;
      uVar3 = (ulong)((uint)values + (int)uVar1);
    }
    anon_unknown_0::Output("Counter value is %u should be %u.\n",uVar5,uVar3);
  }
  return bVar7;
}

Assistant:

bool CheckCounterValues(GLuint size, GLuint* values, GLuint min_value)
	{
		std::sort(values, values + size);
		for (GLuint i = 0; i < size; ++i)
		{
			Output("%u\n", values[i]);
			if (values[i] != i + min_value)
			{
				Output("Counter value is %u should be %u.\n", values[i], i + min_value);
				return false;
			}
		}
		return true;
	}